

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

ECDSA_SIG * ECDSA_do_sign(uchar *dgst,int dgst_len,EC_KEY *eckey)

{
  int iVar1;
  ECDSA_SIG *pEVar2;
  undefined4 in_register_00000034;
  size_t sig_len;
  uint8_t sig [132];
  size_t local_a0;
  uint8_t local_98 [144];
  
  iVar1 = ecdsa_sign_fixed(dgst,CONCAT44(in_register_00000034,dgst_len),local_98,&local_a0,0x84,
                           (EC_KEY *)eckey);
  if (iVar1 == 0) {
    pEVar2 = (ECDSA_SIG *)0x0;
  }
  else {
    pEVar2 = (ECDSA_SIG *)ecdsa_sig_from_fixed((EC_KEY *)eckey,local_98,local_a0);
  }
  return pEVar2;
}

Assistant:

ECDSA_SIG *ECDSA_do_sign(const uint8_t *digest, size_t digest_len,
                         const EC_KEY *eckey) {
  uint8_t sig[ECDSA_MAX_FIXED_LEN];
  size_t sig_len;
  if (!ecdsa_sign_fixed(digest, digest_len, sig, &sig_len, sizeof(sig),
                        eckey)) {
    return NULL;
  }

  return ecdsa_sig_from_fixed(eckey, sig, sig_len);
}